

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int scriptsig_to_witness(uchar *bytes,size_t bytes_len,wally_tx_witness_stack **output)

{
  size_t local_58;
  size_t push_opcode_size;
  size_t push_size;
  wally_tx_witness_stack *pwStack_40;
  int ret;
  wally_tx_witness_stack *result;
  uchar *end;
  uchar *p;
  wally_tx_witness_stack **output_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  result = (wally_tx_witness_stack *)(bytes + bytes_len);
  pwStack_40 = (wally_tx_witness_stack *)0x0;
  push_size._4_4_ = 0;
  if (((bytes == (uchar *)0x0) || (output == (wally_tx_witness_stack **)0x0)) || (bytes_len == 0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    end = bytes;
    p = (uchar *)output;
    output_local = (wally_tx_witness_stack **)bytes_len;
    bytes_len_local = (size_t)bytes;
    bytes_local._4_4_ = wally_tx_witness_stack_init_alloc(2,&stack0xffffffffffffffc0);
    if (bytes_local._4_4_ == 0) {
      for (; push_size._4_4_ = 0, end < result; end = end + push_opcode_size) {
        push_size._4_4_ =
             script_get_push_size_from_bytes(end,(long)result - (long)end,&push_opcode_size);
        if ((push_size._4_4_ != 0) ||
           (push_size._4_4_ =
                 script_get_push_opcode_size_from_bytes(end,(long)result - (long)end,&local_58),
           push_size._4_4_ != 0)) {
LAB_001377f5:
          wally_tx_witness_stack_free(pwStack_40);
          return push_size._4_4_;
        }
        end = end + local_58;
        push_size._4_4_ = wally_tx_witness_stack_add(pwStack_40,end,push_opcode_size);
        if (push_size._4_4_ != 0) goto LAB_001377f5;
      }
      *(wally_tx_witness_stack **)p = pwStack_40;
      bytes_local._4_4_ = 0;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

static int scriptsig_to_witness(unsigned char *bytes, size_t bytes_len, struct wally_tx_witness_stack **output)
{
    unsigned char *p = bytes, *end = p + bytes_len;
    struct wally_tx_witness_stack *result = NULL;
    int ret = WALLY_OK;

    if (!bytes || !output || !bytes_len) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_tx_witness_stack_init_alloc(2, &result)) != WALLY_OK) {
        return ret;
    }

    while (p < end) {
        size_t push_size, push_opcode_size;

        if ((ret = script_get_push_size_from_bytes(p, end - p, &push_size)) != WALLY_OK) {
            goto fail;
        }
        if ((ret = script_get_push_opcode_size_from_bytes(p, end - p, &push_opcode_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_opcode_size;

        if ((ret = wally_tx_witness_stack_add(result, p, push_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_size;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_tx_witness_stack_free(result);
    return ret;
}